

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::ConditionalExpressionSyntax::setChild
          (ConditionalExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00a0ddb0 + *(int *)(&DAT_00a0ddb0 + index * 4)))();
  return;
}

Assistant:

void ConditionalExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: predicate = child.node() ? &child.node()->as<ConditionalPredicateSyntax>() : nullptr; return;
        case 1: question = child.token(); return;
        case 2: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 3: left = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 4: colon = child.token(); return;
        case 5: right = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}